

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

string * loadRandomImage(string *path)

{
  directory_iterator *this;
  bool bVar1;
  result_type_conflict1 rVar2;
  difference_type dVar3;
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string_type local_2868;
  directory_entry *local_2848;
  directory_entry *file;
  directory_iterator local_2838;
  undefined1 local_2828 [8];
  directory_iterator __end1;
  undefined1 local_2808 [8];
  directory_iterator __begin1;
  directory_iterator local_27d0;
  directory_iterator *local_27c0;
  directory_iterator *__range1;
  string s;
  int i;
  result_type n;
  uniform_int_distribution<int> intgen;
  mt19937 gen;
  random_device rd;
  path local_58;
  directory_iterator local_30;
  difference_type local_20;
  difference_type nfiles;
  string *path_local;
  Mat *back;
  
  path_local = path;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_30,&local_58);
  rd.field_0._M_mt._M_p = 0;
  this = (directory_iterator *)((long)&rd.field_0 + 0x1380);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(this);
  dVar3 = std::
          count_if<std::filesystem::__cxx11::directory_iterator,bool(*)(std::filesystem::__cxx11::path_const&)>
                    (&local_30,this,std::filesystem::is_regular_file);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)((long)&rd.field_0 + 0x1380));
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_30);
  std::filesystem::__cxx11::path::~path(&local_58);
  local_20 = dVar3;
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar2 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&intgen,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&i,0,(int)local_20 + -1);
  s.field_2._12_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)&i,
                  (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                   *)&intgen);
  s.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)&__range1);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&__begin1._M_dir._M_refcount,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_27d0,(path *)&__begin1._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dir._M_refcount);
  local_27c0 = &local_27d0;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_27c0);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_2808,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_2838,local_27c0);
  std::filesystem::__cxx11::end((directory_iterator *)local_2828);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_2838);
  do {
    bVar1 = std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)local_2808,(directory_iterator *)local_2828);
    if (!bVar1) {
LAB_0010bc00:
      file._4_4_ = 2;
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_2828);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)local_2808);
      std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_27d0);
      cv::imread((string *)path,(int)&__range1);
      file._4_4_ = 1;
      std::__cxx11::string::~string((string *)&__range1);
      std::random_device::~random_device((random_device *)&gen._M_p);
      return path;
    }
    local_2848 = (directory_entry *)
                 std::filesystem::__cxx11::directory_iterator::operator*
                           ((directory_iterator *)local_2808);
    if (s.field_2._8_4_ == s.field_2._12_4_) {
      this_00 = std::filesystem::__cxx11::directory_entry::path(local_2848);
      std::filesystem::__cxx11::path::operator_cast_to_string(&local_2868,this_00);
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_2868);
      std::__cxx11::string::~string((string *)&local_2868);
      goto LAB_0010bc00;
    }
    s.field_2._8_4_ = s.field_2._8_4_ + 1;
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_2808);
  } while( true );
}

Assistant:

cv::Mat loadRandomImage(string path) {
    using fp = bool (*)(const filesystem::path&);
    auto nfiles = count_if(filesystem::directory_iterator(path), filesystem::directory_iterator{}, (fp)filesystem::is_regular_file);
    random_device rd;  
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(0, nfiles-1);
    auto n = intgen(gen);
    int i=0;
    string s;
    for (const auto & file: filesystem::directory_iterator(path)) {
        if (i == n) {
            s = file.path();
            break;
        }
        i++;
    }
    auto back = cv::imread(s);
    return back;
}